

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::maybeStartDrag(QAbstractItemViewPrivate *this,QPoint eventPosition)

{
  QWidget *this_00;
  long lVar1;
  int iVar2;
  LayoutDirection LVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  QAbstractItemView *q;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  LVar3 = QWidget::layoutDirection(this_00);
  iVar4 = (**(code **)(*(long *)this_00 + 0x2b0))(this_00);
  iVar2 = -iVar4;
  if (LVar3 != RightToLeft) {
    iVar2 = iVar4;
  }
  iVar4 = (**(code **)(*(long *)this_00 + 0x2b8))(this_00);
  iVar6 = (this->pressedPosition).xp.m_i - (iVar2 + eventPosition.xp.m_i.m_i);
  iVar4 = (this->pressedPosition).yp.m_i - (iVar4 + eventPosition.yp.m_i.m_i);
  iVar2 = -iVar6;
  if (0 < iVar6) {
    iVar2 = iVar6;
  }
  iVar6 = -iVar4;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  iVar4 = QApplication::startDragDistance();
  if (iVar4 < iVar6 + iVar2) {
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    QPersistentModelIndex::operator=(&this->pressedIndex,&local_50);
    uVar5 = (**(code **)(*(long *)this->model + 0xf0))();
    (**(code **)(*(long *)this_00 + 0x2f0))(this_00,uVar5);
    lVar1 = *(long *)&this_00->field_0x8;
    *(undefined4 *)(lVar1 + 0x3a8) = 0;
    QBasicTimer::stop();
    *(undefined4 *)(lVar1 + 0x424) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::maybeStartDrag(QPoint eventPosition)
{
    Q_Q(QAbstractItemView);

    const QPoint topLeft = pressedPosition - offset();
    if ((topLeft - eventPosition).manhattanLength() > QApplication::startDragDistance()) {
        pressedIndex = QModelIndex();
        q->startDrag(model->supportedDragActions());
        q->setState(QAbstractItemView::NoState); // the startDrag will return when the dnd operation
                                                 // is done
        q->stopAutoScroll();
    }
}